

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

stream * opentempfile(char *name,char *mode)

{
  bool bVar1;
  char *pcVar2;
  char *local_58;
  filestream *file;
  char *found;
  char *mode_local;
  char *name_local;
  
  pcVar2 = findfile(name,mode);
  name_local = (char *)operator_new(0x10);
  filestream::filestream((filestream *)name_local);
  local_58 = name;
  if (pcVar2 != (char *)0x0) {
    local_58 = pcVar2;
  }
  bVar1 = filestream::opentemp((filestream *)name_local,local_58,mode);
  if (!bVar1) {
    if ((filestream *)name_local != (filestream *)0x0) {
      (*(((filestream *)name_local)->super_stream)._vptr_stream[1])();
    }
    name_local = (char *)0x0;
  }
  return (stream *)name_local;
}

Assistant:

stream *opentempfile(const char *name, const char *mode)
{
    const char *found = findfile(name, mode);
    filestream *file = new filestream;
    if(!file->opentemp(found ? found : name, mode)) { delete file; return NULL; }
    return file;
}